

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

SyntaxKind slang::syntax::SyntaxFacts::getKeywordType(TokenKind kind)

{
  TokenKind kind_local;
  undefined4 local_4;
  
  if (kind == CHandleKeyword) {
    local_4 = CHandleType;
  }
  else if (kind == EventKeyword) {
    local_4 = EventType;
  }
  else if (kind == RealKeyword) {
    local_4 = RealType;
  }
  else if (kind == RealTimeKeyword) {
    local_4 = RealTimeType;
  }
  else if (kind == ShortRealKeyword) {
    local_4 = ShortRealType;
  }
  else if (kind == StringKeyword) {
    local_4 = StringType;
  }
  else if (kind == VoidKeyword) {
    local_4 = VoidType;
  }
  else {
    local_4 = Unknown;
  }
  return local_4;
}

Assistant:

SyntaxKind SyntaxFacts::getKeywordType(TokenKind kind) {
    switch (kind) {
        case TokenKind::ShortRealKeyword: return SyntaxKind::ShortRealType;
        case TokenKind::RealKeyword: return SyntaxKind::RealType;
        case TokenKind::RealTimeKeyword: return SyntaxKind::RealTimeType;
        case TokenKind::StringKeyword: return SyntaxKind::StringType;
        case TokenKind::CHandleKeyword: return SyntaxKind::CHandleType;
        case TokenKind::EventKeyword: return SyntaxKind::EventType;
        case TokenKind::VoidKeyword: return SyntaxKind::VoidType;
        default: return SyntaxKind::Unknown;
    }
}